

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_brts.h
# Opt level: O0

void __thiscall
BRTS<TTA>::FindRunsMem(BRTS<TTA> *this,uint64_t *bits_start,int height,int data_width,Run *runs)

{
  uint64_t *puVar1;
  uchar uVar2;
  ushort uVar3;
  ushort uVar4;
  uint uVar5;
  uint local_98;
  uint label_other;
  uint label;
  unsigned_short end_pos;
  unsigned_short start_pos;
  unsigned_long bitpos_1;
  unsigned_long basepos_1;
  uint64_t working_bits_1;
  uint64_t *bit_final_1;
  uint64_t *bits_1;
  Run *runs_save;
  unsigned_long uStack_58;
  int row;
  unsigned_long bitpos;
  unsigned_long basepos;
  uint64_t working_bits;
  uint64_t *bit_final;
  uint64_t *bits;
  Run *runs_up;
  Run *runs_local;
  int data_width_local;
  int height_local;
  uint64_t *bits_start_local;
  BRTS<TTA> *this_local;
  
  working_bits = (uint64_t)(bits_start + data_width);
  basepos = *bits_start;
  bitpos = 0;
  uStack_58 = 0;
  bit_final = bits_start;
  bits = (uint64_t *)runs;
  runs_up = runs;
  runs_local._0_4_ = data_width;
  runs_local._4_4_ = height;
  _data_width_local = bits_start;
  bits_start_local = (uint64_t *)this;
  while( true ) {
    while (uVar2 = YacclabBitScanForward64(&stack0xffffffffffffffa8,basepos), uVar2 != '\0') {
      runs_up->start_pos = (short)bitpos + (short)uStack_58;
      basepos = (basepos ^ 0xffffffffffffffff) & -1L << ((byte)uStack_58 & 0x3f);
      while (uVar2 = YacclabBitScanForward64(&stack0xffffffffffffffa8,basepos), uVar2 == '\0') {
        bit_final = bit_final + 1;
        bitpos = bitpos + 0x40;
        basepos = *bit_final ^ 0xffffffffffffffff;
      }
      basepos = (basepos ^ 0xffffffffffffffff) & -1L << ((byte)uStack_58 & 0x3f);
      runs_up->end_pos = (short)bitpos + (short)uStack_58;
      uVar5 = TTA::MemNewLabel();
      runs_up->label = uVar5;
      runs_up = runs_up + 1;
    }
    bit_final = bit_final + 1;
    bitpos = bitpos + 0x40;
    if (bit_final == (uint64_t *)working_bits) break;
    basepos = *bit_final;
  }
  runs_up->start_pos = 0xffff;
  runs_up->end_pos = 0xffff;
  runs_save._4_4_ = 1;
  do {
    runs_up = runs_up + 1;
    if (runs_local._4_4_ <= runs_save._4_4_) {
      uVar5 = TTA::MemFlatten();
      (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar5;
      return;
    }
    bits_1 = (uint64_t *)runs_up;
    bit_final_1 = _data_width_local + (int)runs_local * runs_save._4_4_;
    working_bits_1 = (uint64_t)(bit_final_1 + (int)runs_local);
    basepos_1 = *bit_final_1;
    bitpos_1 = 0;
    _label = 0;
LAB_002af0a3:
    while (uVar2 = YacclabBitScanForward64((unsigned_long *)&label,basepos_1), uVar2 != '\0') {
      uVar3 = (short)bitpos_1 + (short)_label;
      basepos_1 = (basepos_1 ^ 0xffffffffffffffff) & -1L << ((byte)_label & 0x3f);
      while (uVar2 = YacclabBitScanForward64((unsigned_long *)&label,basepos_1), uVar2 == '\0') {
        bit_final_1 = bit_final_1 + 1;
        bitpos_1 = bitpos_1 + 0x40;
        basepos_1 = *bit_final_1 ^ 0xffffffffffffffff;
      }
      basepos_1 = (basepos_1 ^ 0xffffffffffffffff) & -1L << ((byte)_label & 0x3f);
      uVar4 = (short)bitpos_1 + (short)_label;
      for (; *(ushort *)((long)bits + 2) < uVar3; bits = bits + 1) {
      }
      if (uVar4 < (ushort)*bits) {
        runs_up->start_pos = uVar3;
        runs_up->end_pos = uVar4;
        uVar5 = TTA::MemNewLabel();
        runs_up->label = uVar5;
      }
      else {
        local_98 = TTA::MemGetLabel(*(uint *)((long)bits + 4));
        puVar1 = bits;
        if (*(ushort *)((long)bits + 2) < uVar4) {
          do {
            bits = puVar1 + 1;
            if (uVar4 < (ushort)*bits) break;
            uVar5 = TTA::MemGetLabel(*(uint *)((long)puVar1 + 0xc));
            if (local_98 != uVar5) {
              local_98 = TTA::MemMerge(local_98,uVar5);
            }
            puVar1 = bits;
          } while (*(ushort *)((long)bits + 2) < uVar4);
          runs_up->start_pos = uVar3;
          runs_up->end_pos = uVar4;
          runs_up->label = local_98;
        }
        else {
          runs_up->start_pos = uVar3;
          runs_up->end_pos = uVar4;
          runs_up->label = local_98;
        }
      }
      runs_up = runs_up + 1;
    }
    bit_final_1 = bit_final_1 + 1;
    bitpos_1 = bitpos_1 + 0x40;
    if (bit_final_1 != (uint64_t *)working_bits_1) {
      basepos_1 = *bit_final_1;
      goto LAB_002af0a3;
    }
    runs_up->start_pos = 0xffff;
    runs_up->end_pos = 0xffff;
    bits = bits_1;
    runs_save._4_4_ = runs_save._4_4_ + 1;
  } while( true );
}

Assistant:

void FindRunsMem(const uint64_t* bits_start, int height, int data_width, Run* runs) {
        Run* runs_up = runs;

        //process runs in the first row
        const uint64_t* bits = bits_start;
        const uint64_t* bit_final = bits + data_width;
        uint64_t working_bits = *bits;
        unsigned long basepos = 0, bitpos = 0;
        for (;; runs++) {
            //find starting position
            while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                bits++, basepos += 64;
                if (bits == bit_final) {
                    runs->start_pos = (short)0xFFFF;
                    runs->end_pos = (short)0xFFFF;
                    runs++;
                    goto out;
                }
                working_bits = *bits;
            }
            runs->start_pos = short(basepos + bitpos);

            //find ending position
            working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
            while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                bits++, basepos += 64;
                working_bits = ~(*bits);
            }
            working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
            runs->end_pos = short(basepos + bitpos);
            runs->label = LabelsSolver::MemNewLabel();
        }
    out:

        //process runs in the rests
        for (int row = 1; row < height; row++) {
            Run* runs_save = runs;
            const uint64_t* bits = bits_start + data_width * row;
            const uint64_t* bit_final = bits + data_width;
            uint64_t working_bits = *bits;
            unsigned long basepos = 0, bitpos = 0;
            for (;; runs++) {
                //find starting position
                while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                    bits++, basepos += 64;
                    if (bits == bit_final) {
                        runs->start_pos = (short)0xFFFF;
                        runs->end_pos = (short)0xFFFF;
                        runs++;
                        goto out2;
                    }
                    working_bits = *bits;
                }
                unsigned short start_pos = short(basepos + bitpos);

                //find ending position
                working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
                while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                    bits++, basepos += 64;
                    working_bits = ~(*bits);
                }
                working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
                unsigned short end_pos = short(basepos + bitpos);

                //Skip upper runs end before this run starts
                for (; runs_up->end_pos < start_pos; runs_up++);

                //No upper run meets this
                if (runs_up->start_pos > end_pos) {
                    runs->start_pos = start_pos;
                    runs->end_pos = end_pos;
                    runs->label = LabelsSolver::MemNewLabel();
                    continue;
                };

                unsigned label = LabelsSolver::MemGetLabel(runs_up->label);

                //Next upper run can not meet this
                if (end_pos <= runs_up->end_pos) {
                    runs->start_pos = start_pos;
                    runs->end_pos = end_pos;
                    runs->label = label;
                    continue;
                }

                //Find next upper runs meet this
                runs_up++;
                for (; runs_up->start_pos <= end_pos; runs_up++) {
                    unsigned label_other = LabelsSolver::MemGetLabel(runs_up->label);
                    if (label != label_other) label = LabelsSolver::MemMerge(label, label_other);
                    if (end_pos <= runs_up->end_pos) break;
                }
                runs->start_pos = start_pos;
                runs->end_pos = end_pos;
                runs->label = label;
            }

        out2:
            runs_up = runs_save;
        }
        n_labels_ = LabelsSolver::MemFlatten();
    }